

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O2

void __thiscall PathTest::NormalizeTest(PathTest *this)

{
  bool bVar1;
  long lVar2;
  Path p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (lVar2 = 0; lVar2 != 0xb0; lVar2 = lVar2 + 0x10) {
    JetHead::Path::Path((Path *)&local_50,*(char **)((long)&normalizeTestData[0].path + lVar2));
    JetHead::Path::normalize();
    bVar1 = std::operator!=(&local_50,*(char **)((long)&normalizeTestData[0].norm_path + lVar2));
    if (bVar1) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xce,"Normalize of %s failed (%s)",
                 *(undefined8 *)((long)&normalizeTestData[0].path + lVar2),local_50._M_dataplus._M_p
                );
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void PathTest::NormalizeTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( normalizeTestData ); i++ )
	{
		Path p = normalizeTestData[ i ].path;
		p.normalize();
		if ( p != normalizeTestData[ i ].norm_path )
			TestFailed( "Normalize of %s failed (%s)", normalizeTestData[ i ].path, p.getString().c_str() );
	}
}